

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_profiler.hpp
# Opt level: O0

void __thiscall fp::collector::~collector(collector *this)

{
  collector *this_local;
  
  report(this);
  std::__cxx11::string::~string((string *)&this->m_fmt);
  return;
}

Assistant:

~collector() noexcept
  {
    report();
  }